

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O2

double __thiscall MetaSim::BaseStat::getVariance(BaseStat *this)

{
  double *pdVar1;
  Exc *pEVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  allocator local_13b;
  allocator local_13a;
  allocator local_139;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (_endOfSim == '\0') {
    pEVar2 = (Exc *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_38,"Can\'t get statistics before end of simulation\n",&local_139);
    std::__cxx11::string::string((string *)&local_58,"BaseStat",&local_13a);
    std::__cxx11::string::string((string *)&local_78,"basestat.hpp",&local_13b);
    Exc::Exc(pEVar2,&local_38,&local_58,&local_78);
    __cxa_throw(pEVar2,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  if (_initFlag == '\0') {
    pEVar2 = (Exc *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_98,"Statistics not initialized",&local_139);
    std::__cxx11::string::string((string *)&local_b8,"BaseStat",&local_13a);
    std::__cxx11::string::string((string *)&local_d8,"basestat.hpp",&local_13b);
    Exc::Exc(pEVar2,&local_98,&local_b8,&local_d8);
    __cxa_throw(pEVar2,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  if (_expNum < 3) {
    pEVar2 = (Exc *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_f8,"Need at least 3 run to evaluate statistic",&local_139);
    std::__cxx11::string::string((string *)&local_118,"BaseStat",&local_13a);
    std::__cxx11::string::string((string *)&local_138,"basestat.hpp",&local_13b);
    Exc::Exc(pEVar2,&local_f8,&local_118,&local_138);
    __cxa_throw(pEVar2,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  dVar4 = getMean(this);
  dVar5 = 0.0;
  for (pdVar1 = (this->_exper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != (this->_exper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    dVar5 = dVar5 + (*pdVar1 - dVar4) * (*pdVar1 - dVar4);
  }
  lVar3 = (_expNum - 1) * _expNum;
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = dVar5 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  if (0.0 <= dVar5) {
    return SQRT(dVar5);
  }
  dVar4 = sqrt(dVar5);
  return dVar4;
}

Assistant:

double BaseStat::getVariance()
    {
        double sum = 0;
        double mu;		// the mean
  
        if (!_endOfSim) throw Exc(GET);
        if (!_initFlag) throw Exc(NO_INIT);
        if (_expNum < 3) throw Exc(NEED_3);

        mu = getMean();

        sum = accumulate(_exper.begin(), _exper.end(), 0.0, V(mu));
        return sqrt(sum/((_expNum - 1) * _expNum));
    }